

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_support.h
# Opt level: O1

int pybind11_getbuffer(PyObject *obj,Py_buffer *view,int flags)

{
  long *plVar1;
  long *plVar2;
  int iVar3;
  tuple_iterator tVar4;
  type_info *ptVar5;
  buffer_info *pbVar6;
  Py_ssize_t PVar7;
  long *plVar8;
  sequence_fast_readonly sVar9;
  handle local_38;
  
  local_38.m_ptr = obj->ob_type->tp_mro;
  if (local_38.m_ptr != (PyObject *)0x0) {
    (local_38.m_ptr)->ob_refcnt = (local_38.m_ptr)->ob_refcnt + 1;
  }
  sVar9.ptr = (PyObject **)&local_38.m_ptr[1].ob_type;
  if (((local_38.m_ptr)->ob_type->tp_flags & 0x2000000) != 0) {
    sVar9.ptr = (PyObject **)*sVar9.ptr;
  }
  tVar4 = pybind11::tuple::end((tuple *)&local_38);
  if ((sequence_fast_readonly)sVar9.ptr == tVar4.super_sequence_fast_readonly.ptr) {
    ptVar5 = (type_info *)0x0;
  }
  else {
    do {
      ptVar5 = pybind11::detail::get_type_info((PyTypeObject *)*sVar9.ptr);
      if ((ptVar5 != (type_info *)0x0) &&
         (ptVar5->get_buffer != (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0)) break;
      sVar9.ptr = sVar9.ptr + 1;
    } while ((sequence_fast_readonly)sVar9.ptr != tVar4.super_sequence_fast_readonly.ptr);
  }
  pybind11::object::~object((object *)&local_38);
  if ((((obj == (PyObject *)0x0) || (view == (Py_buffer *)0x0)) || (ptVar5 == (type_info *)0x0)) ||
     (ptVar5->get_buffer == (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0)) {
    if (view != (Py_buffer *)0x0) {
      view->obj = (PyObject *)0x0;
    }
    PyErr_SetString(_PyExc_BufferError,"pybind11_getbuffer(): Internal error");
    iVar3 = -1;
  }
  else {
    view->suboffsets = (Py_ssize_t *)0x0;
    view->internal = (void *)0x0;
    view->shape = (Py_ssize_t *)0x0;
    view->strides = (Py_ssize_t *)0x0;
    view->readonly = 0;
    view->ndim = 0;
    view->format = (char *)0x0;
    view->len = 0;
    view->itemsize = 0;
    view->buf = (void *)0x0;
    view->obj = (PyObject *)0x0;
    pbVar6 = (*ptVar5->get_buffer)(obj,ptVar5->get_buffer_data);
    view->obj = obj;
    view->ndim = 1;
    view->internal = pbVar6;
    view->buf = *(void **)pbVar6;
    PVar7 = *(Py_ssize_t *)(pbVar6 + 8);
    view->itemsize = PVar7;
    view->len = PVar7;
    plVar1 = *(long **)(pbVar6 + 0x40);
    plVar2 = *(long **)(pbVar6 + 0x48);
    if (plVar1 != plVar2) {
      PVar7 = view->len;
      plVar8 = plVar1;
      do {
        PVar7 = PVar7 * *plVar8;
        view->len = PVar7;
        plVar8 = plVar8 + 1;
      } while (plVar8 != plVar2);
    }
    if ((flags & 4U) != 0) {
      view->format = *(char **)(pbVar6 + 0x18);
    }
    if ((~flags & 0x18U) == 0) {
      view->ndim = *(int *)(pbVar6 + 0x38);
      view->strides = *(Py_ssize_t **)(pbVar6 + 0x58);
      view->shape = plVar1;
    }
    obj->ob_refcnt = obj->ob_refcnt + 1;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

inline int pybind11_getbuffer(PyObject *obj, Py_buffer *view, int flags) {
    // Look for a `get_buffer` implementation in this type's info or any bases (following MRO).
    type_info *tinfo = nullptr;
    for (auto type : reinterpret_borrow<tuple>(Py_TYPE(obj)->tp_mro)) {
        tinfo = get_type_info((PyTypeObject *) type.ptr());
        if (tinfo && tinfo->get_buffer)
            break;
    }
    if (view == nullptr || obj == nullptr || !tinfo || !tinfo->get_buffer) {
        if (view)
            view->obj = nullptr;
        PyErr_SetString(PyExc_BufferError, "pybind11_getbuffer(): Internal error");
        return -1;
    }
    std::memset(view, 0, sizeof(Py_buffer));
    buffer_info *info = tinfo->get_buffer(obj, tinfo->get_buffer_data);
    view->obj = obj;
    view->ndim = 1;
    view->internal = info;
    view->buf = info->ptr;
    view->itemsize = info->itemsize;
    view->len = view->itemsize;
    for (auto s : info->shape)
        view->len *= s;
    if ((flags & PyBUF_FORMAT) == PyBUF_FORMAT)
        view->format = const_cast<char *>(info->format.c_str());
    if ((flags & PyBUF_STRIDES) == PyBUF_STRIDES) {
        view->ndim = (int) info->ndim;
        view->strides = &info->strides[0];
        view->shape = &info->shape[0];
    }
    Py_INCREF(view->obj);
    return 0;
}